

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O1

bool __thiscall irr::scene::CSceneManager::isCulled(CSceneManager *this,ISceneNode *node)

{
  undefined4 *puVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  ulong uVar15;
  bool bVar16;
  int iVar17;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar19;
  undefined8 *puVar20;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  u32 i;
  long lVar21;
  long lVar22;
  float *pfVar23;
  ulong uVar24;
  bool bVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  matrix4 invTrans;
  aabbox3df nbox;
  vector3df edges [8];
  float local_200 [4];
  float local_1f0;
  float local_1ec;
  CMatrix4<float> local_1e8;
  SViewFrustum local_1a0;
  undefined1 local_88 [16];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  long *plVar18;
  
  iVar17 = (*(this->super_ISceneManager)._vptr_ISceneManager[0xe])();
  plVar18 = (long *)CONCAT44(extraout_var,iVar17);
  if (plVar18 == (long *)0x0) {
    bVar25 = false;
  }
  else {
    if ((node->AutomaticCullingState & 8) == 0) {
      bVar25 = false;
    }
    else {
      iVar17 = (*this->Driver->_vptr_IVideoDriver[0x21])(this->Driver,node);
      bVar25 = iVar17 == 0;
    }
    if ((!bVar25) && ((node->AutomaticCullingState & 1) != 0)) {
      iVar17 = (*node->_vptr_ISceneNode[7])(node);
      puVar20 = (undefined8 *)CONCAT44(extraout_var_00,iVar17);
      fVar26 = *(float *)(puVar20 + 1);
      uVar2 = *(undefined4 *)((long)puVar20 + 0x14);
      uVar3 = *puVar20;
      uVar4 = *(undefined8 *)((long)puVar20 + 0xc);
      iVar17 = (*node->_vptr_ISceneNode[10])(node);
      lVar19 = CONCAT44(extraout_var_01,iVar17);
      local_1a0.cameraPosition._0_8_ = uVar3;
      local_1a0.cameraPosition.Z = fVar26;
      local_88._0_8_ = uVar4;
      local_88._8_4_ = uVar2;
      uVar3 = *(undefined8 *)(lVar19 + 0x30);
      local_200[0] = (float)uVar3;
      local_200[1] = SUB84(uVar3,4);
      local_1e8.M[0] = (float)uVar3;
      local_1e8.M[1] = SUB84(uVar3,4);
      local_200[2] = *(float *)(lVar19 + 0x38);
      local_1e8.M[2] = *(float *)(lVar19 + 0x38);
      lVar21 = 0;
      do {
        fVar26 = local_200[lVar21];
        fVar27 = local_1e8.M[lVar21];
        lVar22 = 0;
        do {
          fVar28 = *(float *)(lVar19 + lVar22 * 4);
          fVar29 = *(float *)((long)local_1a0.planes + lVar22 + -0xc) * fVar28;
          fVar28 = fVar28 * *(float *)(local_88 + lVar22);
          fVar30 = fVar29;
          if (fVar28 <= fVar29) {
            fVar30 = fVar28;
          }
          fVar27 = fVar27 + fVar30;
          if (fVar28 <= fVar29) {
            fVar28 = fVar29;
          }
          fVar26 = fVar26 + fVar28;
          lVar22 = lVar22 + 4;
        } while (lVar22 != 0xc);
        local_1e8.M[lVar21] = fVar27;
        local_200[lVar21] = fVar26;
        lVar21 = lVar21 + 1;
        lVar19 = lVar19 + 4;
      } while (lVar21 != 3);
      fVar27 = local_1e8.M[0];
      fVar28 = local_1e8.M[1];
      fVar30 = local_1e8.M[2];
      fVar26 = local_200[0];
      local_1ec = local_200[1];
      local_1f0 = local_200[2];
      lVar19 = (**(code **)(*plVar18 + 0x1b0))(plVar18);
      bVar25 = true;
      if ((((fVar27 <= *(float *)(lVar19 + 0x78)) && (fVar28 <= *(float *)(lVar19 + 0x7c))) &&
          (fVar30 <= *(float *)(lVar19 + 0x80))) &&
         ((*(float *)(lVar19 + 0x6c) <= fVar26 && (*(float *)(lVar19 + 0x70) <= local_1ec)))) {
        bVar25 = local_1f0 < *(float *)(lVar19 + 0x74);
      }
    }
    if ((!bVar25) && ((node->AutomaticCullingState & 4) != 0)) {
      (*node->_vptr_ISceneNode[8])(&local_1a0,node);
      fVar26 = (local_1a0.planes[0].Normal.Z - local_1a0.cameraPosition.Z) *
               (local_1a0.planes[0].Normal.Z - local_1a0.cameraPosition.Z) +
               (local_1a0.planes[0].Normal.X - local_1a0.cameraPosition.X) *
               (local_1a0.planes[0].Normal.X - local_1a0.cameraPosition.X) +
               (local_1a0.planes[0].Normal.Y - local_1a0.cameraPosition.Y) *
               (local_1a0.planes[0].Normal.Y - local_1a0.cameraPosition.Y);
      if (fVar26 < 0.0) {
        fVar26 = sqrtf(fVar26);
      }
      else {
        fVar26 = SQRT(fVar26);
      }
      fVar28 = local_1a0.cameraPosition.X + local_1a0.planes[0].Normal.X;
      fVar30 = local_1a0.cameraPosition.Y + local_1a0.planes[0].Normal.Y;
      fVar27 = local_1a0.cameraPosition.Z + local_1a0.planes[0].Normal.Z;
      lVar19 = (**(code **)(*plVar18 + 0x1b0))(plVar18);
      fVar26 = fVar26 * 0.5 + *(float *)(lVar19 + 0x104);
      lVar19 = (**(code **)(*plVar18 + 0x1b0))(plVar18);
      fVar29 = fVar28 * 0.5 - (float)*(undefined8 *)(lVar19 + 0x10c);
      fVar28 = fVar30 * 0.5 - (float)((ulong)*(undefined8 *)(lVar19 + 0x10c) >> 0x20);
      fVar27 = fVar27 * 0.5 - *(float *)(lVar19 + 0x114);
      bVar25 = fVar26 * fVar26 < fVar27 * fVar27 + fVar29 * fVar29 + fVar28 * fVar28;
    }
    if ((!bVar25) && ((node->AutomaticCullingState & 2) != 0)) {
      puVar20 = (undefined8 *)(**(code **)(*plVar18 + 0x1b0))(plVar18);
      lVar19 = 0xc;
      do {
        *(undefined8 *)((long)local_1a0.planes + lVar19 + -0xc) = 0x3f80000000000000;
        *(undefined8 *)((long)(local_1a0.planes + -1) + 0xc + lVar19) = 0x8000000000000000;
        lVar19 = lVar19 + 0x10;
      } while (lVar19 != 0x6c);
      lVar19 = 0x84;
      do {
        *(undefined8 *)((long)&local_1a0.planes[2].Normal.Y + lVar19) = 0;
        *(undefined8 *)((long)&local_1a0.planes[2].D + lVar19) = 0;
        *(undefined8 *)((long)&local_1a0.planes[1].Normal.Y + lVar19) = 0;
        *(undefined8 *)((long)&local_1a0.planes[1].D + lVar19) = 0;
        *(undefined8 *)((long)&local_1a0.planes[0].Normal.Y + lVar19) = 0;
        *(undefined8 *)((long)&local_1a0.planes[0].D + lVar19) = 0;
        *(undefined8 *)((long)local_1a0.planes + lVar19 + -0xc) = 0;
        *(undefined8 *)((long)(local_1a0.planes + -1) + 0xc + lVar19) = 0;
        *(undefined4 *)((long)&local_1a0.planes[3].Normal.X + lVar19) = 0x3f800000;
        *(undefined4 *)((long)&local_1a0.planes[1].D + lVar19) = 0x3f800000;
        *(undefined4 *)((long)&local_1a0.planes[0].Normal.Z + lVar19) = 0x3f800000;
        *(undefined4 *)((long)local_1a0.planes + lVar19 + -0xc) = 0x3f800000;
        lVar19 = lVar19 + 0x40;
      } while (lVar19 != 0x104);
      local_1a0.cameraPosition.Z = *(float *)(puVar20 + 1);
      local_1a0.cameraPosition._0_8_ = *puVar20;
      local_1a0.boundingBox.MaxEdge._4_8_ = *(undefined8 *)((long)puVar20 + 0x7c);
      local_1a0.boundingBox.MinEdge._0_8_ = *(undefined8 *)((long)puVar20 + 0x6c);
      local_1a0.boundingBox._8_8_ = *(undefined8 *)((long)puVar20 + 0x74);
      lVar19 = 0xc;
      do {
        uVar3 = ((undefined8 *)((long)puVar20 + lVar19))[1];
        *(undefined8 *)((long)local_1a0.planes + lVar19 + -0xc) =
             *(undefined8 *)((long)puVar20 + lVar19);
        *(undefined8 *)((long)(local_1a0.planes + -1) + 0xc + lVar19) = uVar3;
        lVar19 = lVar19 + 0x10;
      } while (lVar19 != 0x6c);
      lVar19 = 0x84;
      do {
        uVar3 = *(undefined8 *)((long)puVar20 + lVar19);
        uVar4 = ((undefined8 *)((long)puVar20 + lVar19))[1];
        puVar1 = (undefined4 *)((long)puVar20 + lVar19 + 0x10);
        uVar2 = *puVar1;
        uVar5 = puVar1[1];
        uVar6 = puVar1[2];
        uVar7 = puVar1[3];
        puVar1 = (undefined4 *)((long)puVar20 + lVar19 + 0x20);
        uVar8 = *puVar1;
        uVar9 = puVar1[1];
        uVar10 = puVar1[2];
        uVar11 = puVar1[3];
        puVar1 = (undefined4 *)((long)puVar20 + lVar19 + 0x30);
        uVar12 = puVar1[1];
        uVar13 = puVar1[2];
        uVar14 = puVar1[3];
        *(undefined4 *)((long)&local_1a0.planes[2].Normal.Y + lVar19) = *puVar1;
        *(undefined4 *)((long)&local_1a0.planes[2].Normal.Z + lVar19) = uVar12;
        *(undefined4 *)((long)&local_1a0.planes[2].D + lVar19) = uVar13;
        *(undefined4 *)((long)&local_1a0.planes[3].Normal.X + lVar19) = uVar14;
        *(undefined4 *)((long)&local_1a0.planes[1].Normal.Y + lVar19) = uVar8;
        *(undefined4 *)((long)&local_1a0.planes[1].Normal.Z + lVar19) = uVar9;
        *(undefined4 *)((long)&local_1a0.planes[1].D + lVar19) = uVar10;
        *(undefined4 *)((long)&local_1a0.planes[2].Normal.X + lVar19) = uVar11;
        *(undefined4 *)((long)&local_1a0.planes[0].Normal.Y + lVar19) = uVar2;
        *(undefined4 *)((long)&local_1a0.planes[0].Normal.Z + lVar19) = uVar5;
        *(undefined4 *)((long)&local_1a0.planes[0].D + lVar19) = uVar6;
        *(undefined4 *)((long)&local_1a0.planes[1].Normal.X + lVar19) = uVar7;
        *(undefined8 *)((long)local_1a0.planes + lVar19 + -0xc) = uVar3;
        *(undefined8 *)((long)(local_1a0.planes + -1) + 0xc + lVar19) = uVar4;
        lVar19 = lVar19 + 0x40;
      } while (lVar19 == 0xc4);
      local_1a0._260_8_ = *(undefined8 *)((long)puVar20 + 0x104);
      local_1a0.BoundingCenter.Z = *(float *)((long)puVar20 + 0x114);
      local_1a0.BoundingCenter._0_8_ = *(undefined8 *)((long)puVar20 + 0x10c);
      iVar17 = (*node->_vptr_ISceneNode[10])(node);
      bVar16 = core::CMatrix4<float>::getInverse
                         ((CMatrix4<float> *)CONCAT44(extraout_var_02,iVar17),&local_1e8);
      if (!bVar16) {
        local_1e8.M[0xc] = 0.0;
        local_1e8.M[0xd] = 0.0;
        local_1e8.M[0xe] = 0.0;
        local_1e8.M[0xf] = 0.0;
        local_1e8.M[8] = 0.0;
        local_1e8.M[9] = 0.0;
        local_1e8.M[10] = 0.0;
        local_1e8.M[0xb] = 0.0;
        local_1e8.M[4] = 0.0;
        local_1e8.M[5] = 0.0;
        local_1e8.M[6] = 0.0;
        local_1e8.M[7] = 0.0;
        local_1e8.M[0] = 0.0;
        local_1e8.M[1] = 0.0;
        local_1e8.M[2] = 0.0;
        local_1e8.M[3] = 0.0;
      }
      lVar19 = 0xc;
      do {
        core::CMatrix4<float>::transformPlane
                  (&local_1e8,(plane3d<float> *)((long)local_1a0.planes + lVar19 + -0xc));
        lVar19 = lVar19 + 0x10;
      } while (lVar19 != 0x6c);
      fVar26 = local_1e8.M[6] * local_1a0.cameraPosition.Y;
      fVar27 = local_1e8.M[2] * local_1a0.cameraPosition.X;
      fVar28 = local_1e8.M[4] * local_1a0.cameraPosition.Y;
      local_1a0.cameraPosition.Y =
           local_1a0.cameraPosition.Z * local_1e8.M[9] +
           local_1a0.cameraPosition.X * local_1e8.M[1] + local_1e8.M[5] * local_1a0.cameraPosition.Y
           + local_1e8.M[0xd];
      local_1a0.cameraPosition.X =
           local_1a0.cameraPosition.Z * local_1e8.M[8] +
           local_1a0.cameraPosition.X * local_1e8.M[0] + fVar28 + local_1e8.M[0xc];
      local_1a0.cameraPosition.Z =
           local_1e8.M[10] * local_1a0.cameraPosition.Z + fVar27 + fVar26 + local_1e8.M[0xe];
      SViewFrustum::recalculateBoundingBox(&local_1a0);
      local_38 = 0;
      uStack_30 = 0;
      local_48 = 0;
      uStack_40 = 0;
      local_58 = 0;
      uStack_50 = 0;
      local_68 = 0;
      uStack_60 = 0;
      local_78 = 0;
      uStack_70 = 0;
      local_88._0_4_ = 0.0;
      local_88._4_4_ = 0.0;
      local_88._8_8_ = 0;
      iVar17 = (*node->_vptr_ISceneNode[7])(node);
      core::aabbox3d<float>::getEdges
                ((aabbox3d<float> *)CONCAT44(extraout_var_03,iVar17),(vector3d<float> *)local_88);
      lVar19 = 0;
      do {
        fVar26 = local_1a0.planes[lVar19].Normal.X;
        fVar27 = local_1a0.planes[lVar19].Normal.Y;
        fVar28 = local_1a0.planes[lVar19].Normal.Z;
        fVar30 = local_1a0.planes[lVar19].D;
        fVar29 = fVar28 * (float)local_88._8_4_ +
                 fVar26 * (float)local_88._0_4_ + fVar27 * (float)local_88._4_4_ + fVar30;
        bVar16 = true;
        if ((-1e-06 <= fVar29) && (1e-06 < fVar29)) {
          pfVar23 = (float *)((long)&local_78 + 4);
          uVar15 = 0;
          do {
            uVar24 = uVar15;
            if (uVar24 == 7) {
              bVar25 = true;
              break;
            }
            fVar29 = *pfVar23 * fVar28 + pfVar23[-2] * fVar26 + pfVar23[-1] * fVar27 + fVar30;
            if (fVar29 < -1e-06) break;
            pfVar23 = pfVar23 + 3;
            uVar15 = uVar24 + 1;
          } while (1e-06 < fVar29);
          bVar16 = uVar24 < 7;
        }
      } while ((bVar16) && (lVar19 = lVar19 + 1, lVar19 != 6));
    }
  }
  return bVar25;
}

Assistant:

bool CSceneManager::isCulled(const ISceneNode *node) const
{
	const ICameraSceneNode *cam = getActiveCamera();
	if (!cam) {
		return false;
	}
	bool result = false;

	// has occlusion query information
	if (node->getAutomaticCulling() & scene::EAC_OCC_QUERY) {
		result = (Driver->getOcclusionQueryResult(const_cast<ISceneNode *>(node)) == 0);
	}

	// can be seen by a bounding box ?
	if (!result && (node->getAutomaticCulling() & scene::EAC_BOX)) {
		core::aabbox3d<f32> tbox = node->getBoundingBox();
		node->getAbsoluteTransformation().transformBoxEx(tbox);
		result = !(tbox.intersectsWithBox(cam->getViewFrustum()->getBoundingBox()));
	}

	// can be seen by a bounding sphere
	if (!result && (node->getAutomaticCulling() & scene::EAC_FRUSTUM_SPHERE)) {
		const core::aabbox3df nbox = node->getTransformedBoundingBox();
		const float rad = nbox.getRadius();
		const core::vector3df center = nbox.getCenter();

		const float camrad = cam->getViewFrustum()->getBoundingRadius();
		const core::vector3df camcenter = cam->getViewFrustum()->getBoundingCenter();

		const float dist = (center - camcenter).getLengthSQ();
		const float maxdist = (rad + camrad) * (rad + camrad);

		result = dist > maxdist;
	}

	// can be seen by cam pyramid planes ?
	if (!result && (node->getAutomaticCulling() & scene::EAC_FRUSTUM_BOX)) {
		SViewFrustum frust = *cam->getViewFrustum();

		// transform the frustum to the node's current absolute transformation
		core::matrix4 invTrans(node->getAbsoluteTransformation(), core::matrix4::EM4CONST_INVERSE);
		// invTrans.makeInverse();
		frust.transform(invTrans);

		core::vector3df edges[8];
		node->getBoundingBox().getEdges(edges);

		for (s32 i = 0; i < scene::SViewFrustum::VF_PLANE_COUNT; ++i) {
			bool boxInFrustum = false;
			for (u32 j = 0; j < 8; ++j) {
				if (frust.planes[i].classifyPointRelation(edges[j]) != core::ISREL3D_FRONT) {
					boxInFrustum = true;
					break;
				}
			}

			if (!boxInFrustum) {
				result = true;
				break;
			}
		}
	}

	return result;
}